

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

MDDOpts FlatZinc::anon_unknown_4::getMDDOpts(Node *ann)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  bool bVar3;
  Call *pCVar4;
  long lVar5;
  undefined8 *puVar6;
  Decomp DVar7;
  Node **i;
  long *plVar8;
  MDDOpts MVar9;
  MDDOpts mopts;
  MDDOpts local_60;
  string local_50;
  
  local_60.expl_alg = E_GREEDY;
  local_60.expl_strat = E_KEEP;
  local_60.decomp = D_PROP;
  DVar7 = D_PROP;
  if (ann != (Node *)0x0) {
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mdd","");
    bVar3 = AST::Node::hasCall(ann,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    DVar7 = D_PROP;
    if (bVar3) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mdd","");
      pCVar4 = AST::Node::getCall(ann,&local_50);
      lVar5 = __dynamic_cast(pCVar4,&AST::Node::typeinfo,&AST::Array::typeinfo,0);
      if (lVar5 == 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "array expected";
        __cxa_throw(puVar6,&AST::TypeError::typeinfo,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      plVar8 = *(long **)(lVar5 + 8);
      plVar2 = *(long **)(lVar5 + 0x10);
      if (plVar8 == plVar2) {
        DVar7 = D_PROP;
      }
      else {
        do {
          if ((*plVar8 != 0) &&
             (lVar5 = __dynamic_cast(*plVar8,&AST::Node::typeinfo,&AST::Atom::typeinfo,0),
             lVar5 != 0)) {
            MDDOpts::parse_arg(&local_60,(string *)(lVar5 + 8));
          }
          plVar8 = plVar8 + 1;
          DVar7 = local_60.decomp;
        } while (plVar8 != plVar2);
      }
    }
  }
  MVar9.decomp = DVar7;
  MVar9.expl_alg = local_60.expl_alg;
  MVar9.expl_strat = local_60.expl_strat;
  return MVar9;
}

Assistant:

inline MDDOpts getMDDOpts(AST::Node* ann) {
	MDDOpts mopts;
	if (ann != nullptr) {
		if (ann->hasCall("mdd")) {
			AST::Array* args(ann->getCall("mdd")->getArray());
			for (auto& i : args->a) {
				if (auto* at = dynamic_cast<AST::Atom*>(i)) {
					mopts.parse_arg(at->id);
				}
			}
		}
	}
	return mopts;
}